

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O1

void secp256k1_modinv64_var(secp256k1_modinv64_signed62 *x,secp256k1_modinv64_modinfo *modinfo)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  int64_t v;
  long lVar8;
  int64_t q;
  long lVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  int64_t u;
  long lVar21;
  int64_t r;
  long lVar22;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_trans2x2 t;
  secp256k1_modinv64_signed62 d;
  secp256k1_modinv64_signed62 e;
  undefined8 uStack_128;
  ulong local_120 [6];
  secp256k1_modinv64_signed62 *local_f0;
  secp256k1_modinv64_modinfo *local_e8;
  ulong local_e0 [7];
  secp256k1_modinv64_trans2x2 local_a8;
  secp256k1_modinv64_signed62 local_88;
  secp256k1_modinv64_signed62 local_58;
  
  local_88.v[2] = 0;
  local_88.v[3] = 0;
  local_88.v[0] = 0;
  local_88.v[1] = 0;
  local_88.v[4] = 0;
  local_58.v[1] = 0;
  local_58.v[4] = 0;
  local_58.v[2] = 0;
  local_58.v[3] = 0;
  local_58.v[0] = 1;
  local_e0[5] = (modinfo->modulus).v[4];
  local_e0[1] = (modinfo->modulus).v[0];
  local_e0[2] = (modinfo->modulus).v[1];
  local_e0[3] = (modinfo->modulus).v[2];
  local_e0[4] = (modinfo->modulus).v[3];
  local_120[5] = x->v[4];
  local_120[1] = x->v[0];
  local_120[2] = x->v[1];
  local_120[3] = x->v[2];
  local_120[4] = x->v[3];
  uVar17 = 5;
  uVar20 = 0xffffffffffffffff;
  local_f0 = x;
  local_e8 = modinfo;
  do {
    uVar11 = local_e0[1];
    lVar3 = 0;
    if ((local_120[1] | 0xc000000000000000) != 0) {
      for (; ((local_120[1] | 0xc000000000000000) >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
      }
    }
    lVar21 = 1L << ((byte)lVar3 & 0x3f);
    lVar22 = 1;
    local_e0[0] = uVar20 - lVar3;
    local_120[0] = local_120[1];
    if (lVar3 == 0x3e) {
      lVar9 = 0;
      lVar3 = 0;
    }
    else {
      iVar2 = 0x3e - (int)lVar3;
      uVar7 = local_120[1] >> ((byte)lVar3 & 0x3f);
      lVar3 = 0;
      lVar9 = 0;
      uVar20 = local_e0[1];
      do {
        iVar10 = (int)uVar7;
        bVar5 = (byte)iVar2;
        if ((long)local_e0[0] < 0) {
          local_e0[0] = -local_e0[0];
          uVar14 = -uVar20;
          lVar13 = -lVar21;
          lVar15 = -lVar3;
          iVar6 = (int)local_e0[0] + 1;
          bVar4 = (byte)iVar6;
          if (iVar2 <= iVar6) {
            bVar4 = bVar5;
          }
          uVar12 = (uint)(0xffffffffffffffff >> (-bVar4 & 0x3f)) &
                   (iVar10 * iVar10 + 0x3e) * iVar10 * (int)uVar14 & 0x3f;
          uVar20 = uVar7;
          lVar8 = lVar22;
          lVar21 = lVar9;
        }
        else {
          iVar6 = (int)local_e0[0] + 1;
          bVar4 = (byte)iVar6;
          if (iVar2 <= iVar6) {
            bVar4 = bVar5;
          }
          uVar12 = (uint)(0xffffffffffffffff >> (-bVar4 & 0x3f)) &
                   -((((int)uVar20 * 2 + 2U & 8) + (int)uVar20) * iVar10) & 0xf;
          lVar8 = lVar3;
          uVar14 = uVar7;
          lVar13 = lVar9;
          lVar15 = lVar22;
        }
        uVar16 = (ulong)uVar12;
        uVar14 = uVar16 * uVar20 + uVar14;
        lVar9 = lVar21 * uVar16 + lVar13;
        uVar7 = -1L << (bVar5 & 0x3f) | uVar14;
        lVar13 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
          }
        }
        bVar5 = (byte)lVar13;
        uVar7 = uVar14 >> (bVar5 & 0x3f);
        lVar21 = lVar21 << (bVar5 & 0x3f);
        lVar3 = lVar8 << (bVar5 & 0x3f);
        lVar22 = lVar15 + uVar16 * lVar8;
        local_e0[0] = local_e0[0] - lVar13;
        iVar2 = iVar2 - (int)lVar13;
      } while (iVar2 != 0);
    }
    uStack_128._4_4_ = uVar17;
    local_a8.u = lVar21;
    local_a8.v = lVar3;
    local_a8.q = lVar9;
    local_a8.r = lVar22;
    secp256k1_modinv64_update_de_62(&local_88,&local_58,&local_a8,modinfo);
    lVar15 = SUB168(SEXT816(lVar3) * SEXT816((long)local_120[0]),8) +
             SUB168(SEXT816(lVar21) * SEXT816((long)uVar11),8) +
             (ulong)CARRY8(lVar3 * local_120[0],lVar21 * uVar11);
    lVar13 = SUB168(SEXT816(lVar22) * SEXT816((long)local_120[0]),8) +
             SUB168(SEXT816(lVar9) * SEXT816((long)uVar11),8) +
             (ulong)CARRY8(lVar22 * local_120[0],lVar9 * uVar11);
    uVar7 = lVar22 * local_120[0] + lVar9 * uVar11 >> 0x3e | lVar13 * 4;
    uVar11 = lVar3 * local_120[0] + lVar21 * uVar11 >> 0x3e | lVar15 * 4;
    if (1 < (int)uStack_128._4_4_) {
      local_120[0] = (ulong)uStack_128._4_4_;
      uVar20 = 1;
      do {
        uVar14 = local_e0[uVar20 + 1];
        uVar16 = local_120[uVar20 + 1];
        uVar18 = uVar14 * lVar21 + uVar11;
        uVar19 = uVar18 + uVar16 * lVar3;
        lVar15 = SUB168(SEXT816((long)uVar14) * SEXT816(lVar21),8) + (lVar15 >> 0x3e) +
                 (ulong)CARRY8(uVar14 * lVar21,uVar11) +
                 SUB168(SEXT816((long)uVar16) * SEXT816(lVar3),8) +
                 (ulong)CARRY8(uVar18,uVar16 * lVar3);
        uVar11 = uVar14 * lVar9 + uVar7;
        uVar18 = uVar11 + uVar16 * lVar22;
        lVar13 = SUB168(SEXT816((long)uVar14) * SEXT816(lVar9),8) + (lVar13 >> 0x3e) +
                 (ulong)CARRY8(uVar14 * lVar9,uVar7) +
                 SUB168(SEXT816((long)uVar16) * SEXT816(lVar22),8) +
                 (ulong)CARRY8(uVar11,uVar16 * lVar22);
        uVar11 = lVar15 * 4 | uVar19 >> 0x3e;
        local_e0[uVar20] = uVar19 & 0x3fffffffffffffff;
        uVar7 = lVar13 * 4 | uVar18 >> 0x3e;
        local_120[uVar20] = uVar18 & 0x3fffffffffffffff;
        uVar20 = uVar20 + 1;
        modinfo = local_e8;
      } while (uStack_128._4_4_ != uVar20);
    }
    lVar3 = (long)(int)uStack_128._4_4_;
    local_e0[lVar3] = uVar11;
    local_120[lVar3] = uVar7;
    uVar20 = local_e0[0];
    uVar17 = uStack_128._4_4_;
    if (local_120[1] == 0) {
      if (1 < (int)uStack_128._4_4_) {
        uVar14 = 1;
        uVar16 = 0;
        do {
          uVar16 = uVar16 | local_120[uVar14 + 1];
          uVar14 = uVar14 + 1;
        } while (uStack_128._4_4_ != uVar14);
        if (uVar16 != 0) goto LAB_0013c9de;
      }
      bVar1 = false;
    }
    else {
LAB_0013c9de:
      bVar1 = true;
      if (((long)uVar7 >> 0x3f == uVar7 && -1 < lVar3 + -2) && (long)uVar11 >> 0x3f == uVar11) {
        uVar17 = uStack_128._4_4_ - 1;
        (&local_e8)[lVar3] =
             (secp256k1_modinv64_modinfo *)((ulong)(&local_e8)[lVar3] | uVar11 << 0x3e);
        (&uStack_128)[lVar3] = (&uStack_128)[lVar3] | uVar7 << 0x3e;
      }
    }
    if (!bVar1) {
      secp256k1_modinv64_normalize_62(&local_88,local_e0[(int)uVar17],modinfo);
      local_f0->v[4] = local_88.v[4];
      local_f0->v[2] = local_88.v[2];
      local_f0->v[3] = local_88.v[3];
      local_f0->v[0] = local_88.v[0];
      local_f0->v[1] = local_88.v[1];
      return;
    }
  } while( true );
}

Assistant:

static void secp256k1_modinv64_var(secp256k1_modinv64_signed62 *x, const secp256k1_modinv64_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, eta=-1. */
    secp256k1_modinv64_signed62 d = {{0, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 e = {{1, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 f = modinfo->modulus;
    secp256k1_modinv64_signed62 g = *x;
#ifdef VERIFY
    int i = 0;
#endif
    int j, len = 5;
    int64_t eta = -1; /* eta = -delta; delta is initially 1 */
    int64_t cond, fn, gn;

    /* Do iterations of 62 divsteps each until g=0. */
    while (1) {
        /* Compute transition matrix and new eta after 62 divsteps. */
        secp256k1_modinv64_trans2x2 t;
        eta = secp256k1_modinv64_divsteps_62_var(eta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv64_update_de_62(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */
#ifdef VERIFY
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */
#endif
        secp256k1_modinv64_update_fg_62_var(len, &f, &g, &t);
        /* If the bottom limb of g is zero, there is a chance that g=0. */
        if (g.v[0] == 0) {
            cond = 0;
            /* Check if the other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= g.v[j];
            }
            /* If so, we're done. */
            if (cond == 0) break;
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0 or -1. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int64_t)len - 2) >> 63;
        cond |= fn ^ (fn >> 63);
        cond |= gn ^ (gn >> 63);
        /* If so, reduce length, propagating the sign of f and g's top limb into the one below. */
        if (cond == 0) {
            f.v[len - 2] |= (uint64_t)fn << 62;
            g.v[len - 2] |= (uint64_t)gn << 62;
            --len;
        }
#ifdef VERIFY
        VERIFY_CHECK(++i < 12); /* We should never need more than 12*62 = 744 divsteps */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */
#endif
    }

    /* At this point g is 0 and (if g was not originally 0) f must now equal +/- GCD of
     * the initial f, g values i.e. +/- 1, and d now contains +/- the modular inverse. */
#ifdef VERIFY
    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &SECP256K1_SIGNED62_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and |f|=modulus) */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &SECP256K1_SIGNED62_ONE, -1) == 0 ||
                 secp256k1_modinv64_mul_cmp_62(&f, len, &SECP256K1_SIGNED62_ONE, 1) == 0 ||
                 (secp256k1_modinv64_mul_cmp_62(x, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  secp256k1_modinv64_mul_cmp_62(&d, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  (secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) == 0 ||
                   secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) == 0)));
#endif

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv64_normalize_62(&d, f.v[len - 1], modinfo);
    *x = d;
}